

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

uint32_t __thiscall
cfd::Psbt::AddTxOutData(Psbt *this,Amount *amount,Address *address,KeyData *key_data)

{
  uint uVar1;
  Script SStack_68;
  
  cfd::core::Address::GetLockingScript();
  uVar1 = cfd::core::Psbt::AddTxOut((Script *)this,(Amount *)&SStack_68);
  core::Script::~Script(&SStack_68);
  cfd::core::Psbt::SetTxOutData((uint)this,(KeyData *)(ulong)uVar1);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const KeyData& key_data) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, key_data);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}